

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.hpp
# Opt level: O1

void __thiscall
generator::tag_b_t<cfgfile::string_trait_t>::tag_b_t
          (tag_b_t<cfgfile::string_trait_t> *this,b_t *cfg)

{
  child_tags_list_t *pcVar1;
  vector_of_tags_t *pvVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *local_68;
  long local_60;
  long local_58 [2];
  string_t local_48;
  
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"integer_field","");
  paVar3 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_68,local_60 + (long)local_68);
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_t_0010fb08;
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  m_name._M_dataplus._M_p =
       (pointer)&(this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).
                 super_tag_t<cfgfile::string_trait_t>.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).
              super_tag_t<cfgfile::string_trait_t>.m_name,local_48._M_dataplus._M_p,
             local_48._M_dataplus._M_p + local_48._M_string_length);
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  m_is_mandatory = true;
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  m_is_defined = false;
  pcVar1 = &(this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).
            super_tag_t<cfgfile::string_trait_t>.m_child_tags;
  (pcVar1->
  super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar1->
  super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    m_child_tags.
    super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined4 *)
   &(this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    m_line_number = 0xffffffff;
  *(undefined4 *)
   ((long)&(this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).
           super_tag_t<cfgfile::string_trait_t>.m_line_number + 4) = 0xffffffff;
  *(undefined4 *)
   &(this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    m_column_number = 0xffffffff;
  *(undefined4 *)
   ((long)&(this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).
           super_tag_t<cfgfile::string_trait_t>.m_column_number + 4) = 0xffffffff;
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_t_0010fac0;
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).m_value = 0;
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).m_constraint = (constraint_t<int> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar3) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_b_t_0010fa38;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a_vector","");
  local_48._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_68,local_60 + (long)local_68);
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (&(this->m_a_vector).super_tag_t<cfgfile::string_trait_t>,
             (tag_t<cfgfile::string_trait_t> *)this,&local_48,false);
  (this->m_a_vector).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_vector_of_tags_t_0010fb50;
  pvVar2 = &(this->m_a_vector).m_tags;
  (pvVar2->
  super__Vector_base<std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_a_vector).m_tags.
    super__Vector_base<std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->m_a_vector).m_current.
  super___shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar3) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  set_cfg(this,cfg);
  return;
}

Assistant:

explicit tag_b_t( const b_t & cfg )
		:	cfgfile::tag_scalar_t< int, Trait >( Trait::from_ascii( "integer_field" ), true )
		,	m_a_vector( *this, Trait::from_ascii( "a_vector" ), false )
	{
		set_cfg( cfg );
	}